

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

void duckdb::ConstantScanPartial<duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  ConstantFillFunction<duckdb::uhugeint_t>(segment,result,result_offset,scan_count);
  return;
}

Assistant:

void ConstantScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                         idx_t result_offset) {
	ConstantFillFunction<T>(segment, result, result_offset, scan_count);
}